

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

bool __thiscall
re2::PCRE::Rewrite(PCRE *this,string *out,StringPiece *rewrite,StringPiece *text,int *vec,int veclen
                  )

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  LogMessage local_1b0;
  
  pcVar5 = rewrite->ptr_;
  pcVar4 = pcVar5 + rewrite->length_;
  do {
    if (pcVar4 <= pcVar5) {
LAB_001260e8:
      return pcVar4 <= pcVar5;
    }
    if (*pcVar5 == '\\') {
      pcVar2 = pcVar5 + 1;
      uVar1 = (int)pcVar5[1] - 0x30;
      if (uVar1 < 10) {
        if (veclen <= (int)uVar1) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x293,2);
          poVar3 = std::operator<<((ostream *)&local_1b0.str_,"requested group ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
          poVar3 = std::operator<<(poVar3," in regexp ");
          std::operator<<(poVar3,rewrite->ptr_);
LAB_001260de:
          LogMessage::~LogMessage(&local_1b0);
          goto LAB_001260e8;
        }
        pcVar5 = pcVar2;
        if (-1 < (long)vec[uVar1 * 2]) {
          std::__cxx11::string::append((char *)out,(ulong)(text->ptr_ + vec[uVar1 * 2]));
        }
      }
      else {
        if (pcVar5[1] != '\\') {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x29e,2);
          poVar3 = std::operator<<((ostream *)&local_1b0.str_,"invalid rewrite pattern: ");
          std::operator<<(poVar3,rewrite->ptr_);
          goto LAB_001260de;
        }
        std::__cxx11::string::push_back((char)out);
        pcVar5 = pcVar2;
      }
    }
    else {
      std::__cxx11::string::push_back((char)out);
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

bool PCRE::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece &text, int *vec, int veclen) const {
  int number_of_capturing_groups = NumberOfCapturingGroups();
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c == '\\') {
      c = *++s;
      if (isdigit(c)) {
        int n = (c - '0');
        if (n >= veclen) {
          if (n <= number_of_capturing_groups) {
            // unmatched optional capturing group. treat
            // its value as empty string; i.e., nothing to append.
          } else {
            PCREPORT(ERROR) << "requested group " << n
                          << " in regexp " << rewrite.data();
            return false;
          }
        }
        int start = vec[2 * n];
        if (start >= 0)
          out->append(text.data() + start, vec[2 * n + 1] - start);
      } else if (c == '\\') {
        out->push_back('\\');
      } else {
        PCREPORT(ERROR) << "invalid rewrite pattern: " << rewrite.data();
        return false;
      }
    } else {
      out->push_back(c);
    }
  }
  return true;
}